

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

WalletTx *
wallet::anon_unknown_5::MakeWalletTx
          (WalletTx *__return_storage_ptr__,CWallet *wallet,CWalletTx *wtx)

{
  CTransactionRef *pCVar1;
  long lVar2;
  element_type *peVar3;
  pointer pCVar4;
  pointer pCVar5;
  bool bVar6;
  isminetype iVar7;
  CAmount CVar8;
  int64_t iVar9;
  CTxIn *txin;
  CTxIn *txin_00;
  pointer txout;
  long in_FS_OFFSET;
  isminetype local_4c;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock5,&wallet->cs_wallet,"wallet.cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/interfaces.cpp"
             ,0x3d,false);
  interfaces::WalletTx::WalletTx(__return_storage_ptr__);
  pCVar1 = &wtx->tx;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
             &pCVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  peVar3 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _GLOBAL__N_1::std::vector<wallet::isminetype,_std::allocator<wallet::isminetype>_>::reserve
            (&__return_storage_ptr__->txin_is_mine,
             ((long)(peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68);
  peVar3 = (pCVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar4 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (txin_00 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start; txin_00 != pCVar4; txin_00 = txin_00 + 1) {
    local_4c = InputIsMine(wallet,txin_00);
    _GLOBAL__N_1::std::vector<wallet::isminetype,_std::allocator<wallet::isminetype>_>::
    emplace_back<wallet::isminetype>(&__return_storage_ptr__->txin_is_mine,&local_4c);
  }
  peVar3 = (pCVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  _GLOBAL__N_1::std::vector<wallet::isminetype,_std::allocator<wallet::isminetype>_>::reserve
            (&__return_storage_ptr__->txout_is_mine,
             ((long)(peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x28);
  peVar3 = (pCVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  _GLOBAL__N_1::std::
  vector<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
  ::reserve(&__return_storage_ptr__->txout_address,
            ((long)(peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x28);
  peVar3 = (pCVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  _GLOBAL__N_1::std::vector<wallet::isminetype,_std::allocator<wallet::isminetype>_>::reserve
            (&__return_storage_ptr__->txout_address_is_mine,
             ((long)(peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x28);
  peVar3 = (pCVar1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar5 = (peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (txout = (peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start; txout != pCVar5; txout = txout + 1) {
    local_4c = CWallet::IsMine(wallet,txout);
    _GLOBAL__N_1::std::vector<wallet::isminetype,_std::allocator<wallet::isminetype>_>::
    emplace_back<wallet::isminetype>(&__return_storage_ptr__->txout_is_mine,&local_4c);
    bVar6 = OutputIsChange(wallet,txout);
    _GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::push_back
              (&__return_storage_ptr__->txout_is_change,bVar6);
    _GLOBAL__N_1::std::
    vector<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
    ::emplace_back<>(&__return_storage_ptr__->txout_address);
    bVar6 = ExtractDestination(&txout->scriptPubKey,
                               (__return_storage_ptr__->txout_address).
                               super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + -1);
    iVar7 = ISMINE_NO;
    if (bVar6) {
      iVar7 = CWallet::IsMine(wallet,(__return_storage_ptr__->txout_address).
                                     super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -1);
    }
    local_4c = iVar7;
    _GLOBAL__N_1::std::vector<wallet::isminetype,_std::allocator<wallet::isminetype>_>::
    emplace_back<wallet::isminetype>(&__return_storage_ptr__->txout_address_is_mine,&local_4c);
  }
  local_4c = ISMINE_ALL;
  CVar8 = CachedTxGetCredit(wallet,wtx,&local_4c);
  __return_storage_ptr__->credit = CVar8;
  local_4c = ISMINE_ALL;
  CVar8 = CachedTxGetDebit(wallet,wtx,&local_4c);
  __return_storage_ptr__->debit = CVar8;
  CVar8 = CachedTxGetChange(wallet,wtx);
  __return_storage_ptr__->change = CVar8;
  iVar9 = CWalletTx::GetTxTime(wtx);
  __return_storage_ptr__->time = iVar9;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&__return_storage_ptr__->value_map,
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)wtx);
  bVar6 = CWalletTx::IsCoinBase(wtx);
  __return_storage_ptr__->is_coinbase = bVar6;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock5.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

WalletTx MakeWalletTx(CWallet& wallet, const CWalletTx& wtx)
{
    LOCK(wallet.cs_wallet);
    WalletTx result;
    result.tx = wtx.tx;
    result.txin_is_mine.reserve(wtx.tx->vin.size());
    for (const auto& txin : wtx.tx->vin) {
        result.txin_is_mine.emplace_back(InputIsMine(wallet, txin));
    }
    result.txout_is_mine.reserve(wtx.tx->vout.size());
    result.txout_address.reserve(wtx.tx->vout.size());
    result.txout_address_is_mine.reserve(wtx.tx->vout.size());
    for (const auto& txout : wtx.tx->vout) {
        result.txout_is_mine.emplace_back(wallet.IsMine(txout));
        result.txout_is_change.push_back(OutputIsChange(wallet, txout));
        result.txout_address.emplace_back();
        result.txout_address_is_mine.emplace_back(ExtractDestination(txout.scriptPubKey, result.txout_address.back()) ?
                                                      wallet.IsMine(result.txout_address.back()) :
                                                      ISMINE_NO);
    }
    result.credit = CachedTxGetCredit(wallet, wtx, ISMINE_ALL);
    result.debit = CachedTxGetDebit(wallet, wtx, ISMINE_ALL);
    result.change = CachedTxGetChange(wallet, wtx);
    result.time = wtx.GetTxTime();
    result.value_map = wtx.mapValue;
    result.is_coinbase = wtx.IsCoinBase();
    return result;
}